

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizard::setOptions(QWizard *this,WizardOptions options)

{
  long lVar1;
  bool bVar2;
  QFlagsStorage<QWizard::WizardOption> QVar3;
  Int IVar4;
  QFlags<QWizard::WizardOption> other;
  QWizardPrivate *this_00;
  Int in_ESI;
  long in_FS_OFFSET;
  QWizardPrivate *d;
  WizardOptions changed;
  QWizardPrivate *in_stack_00000088;
  WizardOption in_stack_ffffffffffffff8c;
  enum_type in_stack_ffffffffffffff90;
  enum_type in_stack_ffffffffffffff94;
  enum_type f1;
  QFlagsStorage<QWizard::WizardOption> in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  QFlagsStorageHelper<QWizard::WizardOption,_4> local_3c;
  QFlagsStorageHelper<QWizard::WizardOption,_4> local_38;
  QFlagsStorageHelper<QWizard::WizardOption,_4> local_34;
  QFlagsStorageHelper<QWizard::WizardOption,_4> local_30;
  QFlagsStorageHelper<QWizard::WizardOption,_4> local_2c;
  QFlagsStorageHelper<QWizard::WizardOption,_4> local_28;
  QFlagsStorageHelper<QWizard::WizardOption,_4> local_24;
  QFlagsStorageHelper<QWizard::WizardOption,_4> local_20;
  QFlagsStorageHelper<QWizard::WizardOption,_4> local_1c;
  QFlagsStorageHelper<QWizard::WizardOption,_4> local_18;
  Int local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QWizard *)0x7bb579);
  local_14 = (this_00->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
             super_QFlagsStorage<QWizard::WizardOption>.i;
  QVar3.i = (Int)QFlags<QWizard::WizardOption>::operator^
                           ((QFlags<QWizard::WizardOption> *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            in_stack_ffffffffffffff98.i);
  bVar2 = QFlags<QWizard::WizardOption>::operator!
                    ((QFlags<QWizard::WizardOption> *)&stack0xfffffffffffffff0);
  if (!bVar2) {
    QWizardPrivate::disableUpdates
              ((QWizardPrivate *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    (this_00->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
    super_QFlagsStorage<QWizard::WizardOption>.i = in_ESI;
    local_18.super_QFlagsStorage<QWizard::WizardOption>.i =
         (QFlagsStorage<QWizard::WizardOption>)
         QFlags<QWizard::WizardOption>::operator&
                   ((QFlags<QWizard::WizardOption> *)
                    CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff8c);
    IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_18);
    f1 = in_stack_ffffffffffffff94 & 0xffffff;
    if (IVar4 != 0) {
      local_1c.super_QFlagsStorage<QWizard::WizardOption>.i =
           (QFlagsStorage<QWizard::WizardOption>)
           QFlags<QWizard::WizardOption>::operator&
                     ((QFlags<QWizard::WizardOption> *)
                      (CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90) &
                      0xffffffffffffff),in_stack_ffffffffffffff8c);
      bVar2 = QFlags<QWizard::WizardOption>::operator!((QFlags<QWizard::WizardOption> *)&local_1c);
      f1 = CONCAT13(bVar2,(int3)f1);
    }
    if ((char)(f1 >> 0x18) != '\0') {
      QWizardPrivate::cleanupPagesNotInHistory(this_00);
    }
    local_38.super_QFlagsStorage<QWizard::WizardOption>.i =
         (QFlagsStorage<QWizard::WizardOption>)::operator|(f1,in_stack_ffffffffffffff90);
    local_34.super_QFlagsStorage<QWizard::WizardOption>.i =
         (QFlagsStorage<QWizard::WizardOption>)
         QFlags<QWizard::WizardOption>::operator|
                   ((QFlags<QWizard::WizardOption> *)CONCAT44(f1,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff8c);
    local_30.super_QFlagsStorage<QWizard::WizardOption>.i =
         (QFlagsStorage<QWizard::WizardOption>)
         QFlags<QWizard::WizardOption>::operator|
                   ((QFlags<QWizard::WizardOption> *)CONCAT44(f1,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff8c);
    local_2c.super_QFlagsStorage<QWizard::WizardOption>.i =
         (QFlagsStorage<QWizard::WizardOption>)
         QFlags<QWizard::WizardOption>::operator|
                   ((QFlags<QWizard::WizardOption> *)CONCAT44(f1,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff8c);
    local_28.super_QFlagsStorage<QWizard::WizardOption>.i =
         (QFlagsStorage<QWizard::WizardOption>)
         QFlags<QWizard::WizardOption>::operator|
                   ((QFlags<QWizard::WizardOption> *)CONCAT44(f1,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff8c);
    local_24.super_QFlagsStorage<QWizard::WizardOption>.i =
         (QFlagsStorage<QWizard::WizardOption>)
         QFlags<QWizard::WizardOption>::operator|
                   ((QFlags<QWizard::WizardOption> *)CONCAT44(f1,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff8c);
    QFlags<QWizard::WizardOption>::operator|
              ((QFlags<QWizard::WizardOption> *)CONCAT44(f1,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff8c);
    local_20.super_QFlagsStorage<QWizard::WizardOption>.i =
         (QFlagsStorage<QWizard::WizardOption>)
         QFlags<QWizard::WizardOption>::operator&
                   ((QFlags<QWizard::WizardOption> *)CONCAT44(f1,in_stack_ffffffffffffff90),
                    (QFlags<QWizard::WizardOption>)in_stack_ffffffffffffff98.i);
    IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_20);
    if (IVar4 == 0) {
      ::operator|(f1,in_stack_ffffffffffffff90);
      QFlags<QWizard::WizardOption>::operator|
                ((QFlags<QWizard::WizardOption> *)CONCAT44(f1,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8c);
      QFlags<QWizard::WizardOption>::operator|
                ((QFlags<QWizard::WizardOption> *)CONCAT44(f1,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8c);
      QFlags<QWizard::WizardOption>::operator|
                ((QFlags<QWizard::WizardOption> *)CONCAT44(f1,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8c);
      other = QFlags<QWizard::WizardOption>::operator|
                        ((QFlags<QWizard::WizardOption> *)CONCAT44(f1,in_stack_ffffffffffffff90),
                         in_stack_ffffffffffffff8c);
      local_3c.super_QFlagsStorage<QWizard::WizardOption>.i =
           (QFlagsStorage<QWizard::WizardOption>)
           QFlags<QWizard::WizardOption>::operator&
                     ((QFlags<QWizard::WizardOption> *)CONCAT44(f1,in_stack_ffffffffffffff90),other)
      ;
      IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_3c);
      if (IVar4 != 0) {
        QWizardPrivate::_q_updateButtonStates(in_stack_00000088);
      }
    }
    else {
      QWizardPrivate::updateButtonLayout
                ((QWizardPrivate *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    QWizardPrivate::enableUpdates((QWizardPrivate *)CONCAT44(f1,in_stack_ffffffffffffff90));
    QWizardPrivate::updateLayout((QWizardPrivate *)CONCAT44(in_ESI,QVar3.i));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizard::setOptions(WizardOptions options)
{
    Q_D(QWizard);

    WizardOptions changed = (options ^ d->opts);
    if (!changed)
        return;

    d->disableUpdates();

    d->opts = options;
    if ((changed & IndependentPages) && !(d->opts & IndependentPages))
        d->cleanupPagesNotInHistory();

    if (changed & (NoDefaultButton | HaveHelpButton | HelpButtonOnRight | NoCancelButton
                   | CancelButtonOnLeft | HaveCustomButton1 | HaveCustomButton2
                   | HaveCustomButton3)) {
        d->updateButtonLayout();
    } else if (changed & (NoBackButtonOnStartPage | NoBackButtonOnLastPage
                          | HaveNextButtonOnLastPage | HaveFinishButtonOnEarlyPages
                          | DisabledBackButtonOnLastPage | NoCancelButtonOnLastPage)) {
        d->_q_updateButtonStates();
    }

    d->enableUpdates();
    d->updateLayout();
}